

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::MeshLoader::initializePositionsOffset(MeshLoader *this)

{
  bool bVar1;
  InputShared *pIVar2;
  SourceBase *pSVar3;
  bool bVar4;
  allocator<char> local_181;
  String local_180;
  String local_160;
  String sourceId;
  String local_120;
  URI inputUrl;
  
  pIVar2 = MeshPrimitiveInputList::getPositionInput(&this->mMeshPrimitiveInputs);
  if (pIVar2 == (InputShared *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"No positions, can\'t import!",(allocator<char> *)&inputUrl);
    bVar4 = IFilePartLoader::handleFWLError
                      ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_120,SEVERITY_CRITICAL);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    this->mPositionsOffset = pIVar2->mOffset;
    bVar4 = false;
  }
  COLLADABU::URI::URI(&inputUrl,&(pIVar2->super_InputUnshared).mSource,false);
  std::__cxx11::string::string((string *)&sourceId,(string *)&inputUrl.mFragment);
  pSVar3 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&sourceId);
  if (pSVar3 == (SourceBase *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Positions sourceBase is null.",&local_181);
    bVar1 = IFilePartLoader::handleFWLError
                      ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_160,SEVERITY_CRITICAL);
    bVar4 = (bool)(bVar4 | bVar1);
    std::__cxx11::string::~string((string *)&local_160);
  }
  else {
    if (pSVar3->mStride != 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"Positios stride is not three.",&local_181);
      bVar1 = IFilePartLoader::handleFWLError
                        ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,&local_180,SEVERITY_CRITICAL);
      bVar4 = (bool)(bVar4 | bVar1);
      std::__cxx11::string::~string((string *)&local_180);
    }
    this->mPositionsIndexOffset = (uint)pSVar3->mInitialIndex;
  }
  std::__cxx11::string::~string((string *)&sourceId);
  COLLADABU::URI::~URI(&inputUrl);
  return bVar4;
}

Assistant:

bool MeshLoader::initializePositionsOffset ()
    {
        bool has_errors = false;
        const InputShared* positionInput = mMeshPrimitiveInputs.getPositionInput ();
        COLLADABU_ASSERT ( positionInput != 0 );
        if (positionInput == 0) {
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "No positions, can't import!", IError::SEVERITY_CRITICAL);
        }
        else {
            // Get the offset value, the initial index values and alloc the memory.
            mPositionsOffset = positionInput->getOffset();
        }

        COLLADABU::URI inputUrl = positionInput->getSource ();
        String sourceId = inputUrl.getFragment ();
        const SourceBase* sourceBase = getSourceById ( sourceId );
        COLLADABU_ASSERT ( sourceBase != 0 );
        if ( sourceBase == 0 )
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positions sourceBase is null.", IError::SEVERITY_CRITICAL);
        else {
            // only stride 3 makes sense for normals
            unsigned long long stride = sourceBase->getStride();
            if (stride != 3)
                has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positios stride is not three.", IError::SEVERITY_CRITICAL);

            mPositionsIndexOffset = (unsigned int)sourceBase->getInitialIndex();
        }
        return has_errors;
    }